

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O2

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::MTex>
          (Structure *this,MTex *dest,FileDatabase *db)

{
  uint in_EAX;
  int temp;
  int temp_short;
  undefined8 local_28;
  
  local_28 = (ulong)in_EAX;
  ReadField<1,int>(this,(int *)((long)&local_28 + 4),"mapto",db);
  dest->mapto = local_28._4_4_;
  local_28 = (ulong)local_28._4_4_ << 0x20;
  ReadField<1,int>(this,(int *)&local_28,"blendtype",db);
  dest->blendtype = (Projection)local_28;
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>(this,&dest->object,"*object",db,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Tex>(this,&dest->tex,"*tex",db,false);
  ReadFieldArray<1,char,32ul>(this,&dest->uvname,"uvname",db);
  ReadField<1,int>(this,(int *)&local_28,"projx",db);
  dest->projx = (Projection)local_28;
  ReadField<1,int>(this,(int *)&local_28,"projy",db);
  dest->projy = (Projection)local_28;
  ReadField<1,int>(this,(int *)&local_28,"projz",db);
  dest->projz = (Projection)local_28;
  ReadField<1,char>(this,&dest->mapping,"mapping",db);
  ReadFieldArray<1,float,3ul>(this,&dest->ofs,"ofs",db);
  ReadFieldArray<1,float,3ul>(this,&dest->size,"size",db);
  ReadField<1,float>(this,&dest->rot,"rot",db);
  ReadField<1,int>(this,&dest->texflag,"texflag",db);
  ReadField<1,short>(this,&dest->colormodel,"colormodel",db);
  ReadField<1,short>(this,&dest->pmapto,"pmapto",db);
  ReadField<1,short>(this,&dest->pmaptoneg,"pmaptoneg",db);
  ReadField<1,float>(this,&dest->r,"r",db);
  ReadField<1,float>(this,&dest->g,"g",db);
  ReadField<1,float>(this,&dest->b,"b",db);
  ReadField<1,float>(this,&dest->k,"k",db);
  ReadField<1,float>(this,&dest->colspecfac,"colspecfac",db);
  ReadField<1,float>(this,&dest->mirrfac,"mirrfac",db);
  ReadField<1,float>(this,&dest->alphafac,"alphafac",db);
  ReadField<1,float>(this,&dest->difffac,"difffac",db);
  ReadField<1,float>(this,&dest->specfac,"specfac",db);
  ReadField<1,float>(this,&dest->emitfac,"emitfac",db);
  ReadField<1,float>(this,&dest->hardfac,"hardfac",db);
  ReadField<1,float>(this,&dest->norfac,"norfac",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<MTex> (
    MTex& dest,
    const FileDatabase& db
    ) const
{

    int temp_short = 0;
    ReadField<ErrorPolicy_Igno>(temp_short,"mapto",db);
    dest.mapto = static_cast<Assimp::Blender::MTex::MapType>(temp_short);
    int temp = 0;
    ReadField<ErrorPolicy_Igno>(temp,"blendtype",db);
    dest.blendtype = static_cast<Assimp::Blender::MTex::BlendType>(temp);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.object,"*object",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.tex,"*tex",db);
    ReadFieldArray<ErrorPolicy_Igno>(dest.uvname,"uvname",db);
    ReadField<ErrorPolicy_Igno>(temp,"projx",db);
    dest.projx = static_cast<Assimp::Blender::MTex::Projection>(temp);
    ReadField<ErrorPolicy_Igno>(temp,"projy",db);
    dest.projy = static_cast<Assimp::Blender::MTex::Projection>(temp);
    ReadField<ErrorPolicy_Igno>(temp,"projz",db);
    dest.projz = static_cast<Assimp::Blender::MTex::Projection>(temp);
    ReadField<ErrorPolicy_Igno>(dest.mapping,"mapping",db);
    ReadFieldArray<ErrorPolicy_Igno>(dest.ofs,"ofs",db);
    ReadFieldArray<ErrorPolicy_Igno>(dest.size,"size",db);
    ReadField<ErrorPolicy_Igno>(dest.rot,"rot",db);
    ReadField<ErrorPolicy_Igno>(dest.texflag,"texflag",db);
    ReadField<ErrorPolicy_Igno>(dest.colormodel,"colormodel",db);
    ReadField<ErrorPolicy_Igno>(dest.pmapto,"pmapto",db);
    ReadField<ErrorPolicy_Igno>(dest.pmaptoneg,"pmaptoneg",db);
    ReadField<ErrorPolicy_Warn>(dest.r,"r",db);
    ReadField<ErrorPolicy_Warn>(dest.g,"g",db);
    ReadField<ErrorPolicy_Warn>(dest.b,"b",db);
    ReadField<ErrorPolicy_Warn>(dest.k,"k",db);
    ReadField<ErrorPolicy_Igno>(dest.colspecfac,"colspecfac",db);
    ReadField<ErrorPolicy_Igno>(dest.mirrfac,"mirrfac",db);
    ReadField<ErrorPolicy_Igno>(dest.alphafac,"alphafac",db);
    ReadField<ErrorPolicy_Igno>(dest.difffac,"difffac",db);
    ReadField<ErrorPolicy_Igno>(dest.specfac,"specfac",db);
    ReadField<ErrorPolicy_Igno>(dest.emitfac,"emitfac",db);
    ReadField<ErrorPolicy_Igno>(dest.hardfac,"hardfac",db);
    ReadField<ErrorPolicy_Igno>(dest.norfac,"norfac",db);

    db.reader->IncPtr(size);
}